

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

uint * GetCodeCmdCallPrologue(CodeGenRegVmContext *ctx,uint microcodePos)

{
  uint uVar1;
  uint num;
  uint uVar2;
  uint *puVar3;
  uint size;
  uint offset;
  uint reg;
  uint value;
  uint tempStackPtrOffset;
  x86Reg rTempStack;
  uint *microcode;
  uint microcodePos_local;
  CodeGenRegVmContext *ctx_local;
  
  puVar3 = ctx->exRegVmConstants;
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEBP,sQWORD,rR13,
                   ((int)ctx->vmState + 0x108) - (int)ctx->vmState);
  reg = 0;
  puVar3 = puVar3 + microcodePos;
  while (_tempStackPtrOffset = puVar3, *_tempStackPtrOffset != 1) {
    puVar3 = _tempStackPtrOffset + 1;
    switch(*_tempStackPtrOffset) {
    case 2:
      EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,rEAX,sDWORD,rEBX,*puVar3 << 3);
      EMIT_OP_RPTR_REG(&ctx->ctx,o_mov,sDWORD,rEBP,reg,rEAX);
      reg = reg + 4;
      puVar3 = _tempStackPtrOffset + 2;
      break;
    case 3:
      EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEAX,sQWORD,rEBX,*puVar3 << 3);
      EMIT_OP_RPTR_REG(&ctx->ctx,o_mov64,sQWORD,rEBP,reg,rEAX);
      reg = reg + 8;
      puVar3 = _tempStackPtrOffset + 2;
      break;
    case 4:
      EMIT_OP_RPTR_NUM(&ctx->ctx,o_mov,sDWORD,rEBP,reg,*puVar3);
      reg = reg + 4;
      puVar3 = _tempStackPtrOffset + 2;
      break;
    case 5:
      uVar1 = *puVar3;
      if (uVar1 < 0x80000000) {
        EMIT_OP_RPTR_NUM(&ctx->ctx,o_mov64,sQWORD,rEBP,reg,uVar1);
      }
      else {
        EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rEAX,uVar1);
        EMIT_OP_RPTR_REG(&ctx->ctx,o_mov64,sQWORD,rEBP,reg,rEAX);
      }
      reg = reg + 8;
      puVar3 = _tempStackPtrOffset + 2;
      break;
    case 6:
      uVar1 = *puVar3;
      num = _tempStackPtrOffset[2];
      uVar2 = _tempStackPtrOffset[3];
      if (uVar1 == 1) {
        EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rESI,rR15);
      }
      else if (uVar1 == 2) {
        EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rESI,rR14);
      }
      else if (uVar1 == 3) {
        EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rESI,rEBX);
      }
      else {
        EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rESI,sQWORD,rEBX,uVar1 << 3);
      }
      EMIT_OP_REG_NUM(&ctx->ctx,o_add64,rESI,num);
      EMIT_OP_REG_RPTR(&ctx->ctx,o_lea,rEDI,sQWORD,rEBP,reg);
      EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rECX,uVar2 >> 2);
      EMIT_OP(&ctx->ctx,o_rep_movsd);
      reg = uVar2 + reg;
      puVar3 = _tempStackPtrOffset + 4;
    }
  }
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEDX,sQWORD,rR13,
                   ((int)ctx->vmState + 0x120) - (int)ctx->vmState);
  EMIT_OP_RPTR_NUM(&ctx->ctx,o_mov,sDWORD,rEDX,
                   (int)ctx->vmState->callStackBase - (int)ctx->vmState->callStackBase,
                   ctx->currInstructionPos + 1);
  EMIT_OP_RPTR_NUM(&ctx->ctx,o_add64,sQWORD,rR13,((int)ctx->vmState + 0x120) - (int)ctx->vmState,4);
  return _tempStackPtrOffset + 1;
}

Assistant:

unsigned* GetCodeCmdCallPrologue(CodeGenRegVmContext &ctx, unsigned microcodePos)
{
	// Push arguments
	unsigned *microcode = ctx.exRegVmConstants + microcodePos;

#if defined(_M_X64)
	x86Reg rTempStack = rRBP;

	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rTempStack, sQWORD, rR13, nullcOffsetOf(ctx.vmState, dataStackTop));

	unsigned tempStackPtrOffset = 0;

	while(*microcode != rvmiCall)
	{
		switch(*microcode++)
		{
		case rvmiPush:
			EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, *microcode++ * 8);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rTempStack, tempStackPtrOffset, rEAX);
			tempStackPtrOffset += sizeof(int);
			break;
		case rvmiPushQword:
			EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRAX, sQWORD, rREG, *microcode++ * 8);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rTempStack, tempStackPtrOffset, rRAX);
			tempStackPtrOffset += sizeof(long long);
			break;
		case rvmiPushImm:
			EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, rTempStack, tempStackPtrOffset, *microcode++);
			tempStackPtrOffset += sizeof(int);
			break;
		case rvmiPushImmq:
		{
			unsigned value = *microcode++;
			if(value < 0x80000000)
			{
				EMIT_OP_RPTR_NUM(ctx.ctx, o_mov64, sQWORD, rTempStack, tempStackPtrOffset, value);
			}
			else
			{
				EMIT_OP_REG_NUM(ctx.ctx, o_mov, rEAX, value);
				EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rTempStack, tempStackPtrOffset, rRAX);
			}
			tempStackPtrOffset += sizeof(long long);
		}
			break;
		case rvmiPushMem:
		{
			unsigned reg = *microcode++;
			unsigned offset = *microcode++;
			unsigned size = *microcode++;

			if(reg == rvrrFrame)
				EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRSI, rR15);
			else if(reg == rvrrConstants)
				EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRSI, rR14);
			else if(reg == rvrrRegisters)
				EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRSI, rRBX);
			else
				EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRSI, sQWORD, rREG, reg * 8);

			EMIT_OP_REG_NUM(ctx.ctx, o_add64, rRSI, offset);
			EMIT_OP_REG_RPTR(ctx.ctx, o_lea, rRDI, sQWORD, rTempStack, tempStackPtrOffset);
			EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, size >> 2);
			EMIT_OP(ctx.ctx, o_rep_movsd);

			tempStackPtrOffset += size;
		}
		break;
		}
	}

	// Add call stack frame
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDX, sQWORD, rR13, nullcOffsetOf(ctx.vmState, callStackTop));
	EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, rRDX, nullcOffsetOf(ctx.vmState->callStackBase, instruction), ctx.currInstructionPos + 1); // vmState->callStackTop->instruction = vmState->callInstructionPos + 1;
	EMIT_OP_RPTR_NUM(ctx.ctx, o_add64, sQWORD, rR13, nullcOffsetOf(ctx.vmState, callStackTop), sizeof(CodeGenRegVmCallStackEntry)); // vmState->callStackTop++;
#else
	x86Reg rTempStack = rEDX;

	EMIT_OP_REG_ADDR(ctx.ctx, o_mov, rTempStack, sDWORD, uintptr_t(&ctx.vmState->dataStackTop));

	unsigned tempStackPtrOffset = 0;

	while(*microcode != rvmiCall)
	{
		switch(*microcode++)
		{
		case rvmiPush:
			EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, *microcode++ * 8);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rTempStack, tempStackPtrOffset, rEAX);
			tempStackPtrOffset += sizeof(int);
			break;
		case rvmiPushQword:
			EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, *microcode * 8);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rTempStack, tempStackPtrOffset, rEAX);
			EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, *microcode++ * 8 + 4);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rTempStack, tempStackPtrOffset + 4, rEAX);
			tempStackPtrOffset += sizeof(long long);
			break;
		case rvmiPushImm:
			EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, rTempStack, tempStackPtrOffset, *microcode++);
			tempStackPtrOffset += sizeof(int);
			break;
		case rvmiPushImmq:
			EMIT_OP_REG_NUM(ctx.ctx, o_mov, rEAX, *microcode++);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rTempStack, tempStackPtrOffset, rEAX);
			EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, rTempStack, tempStackPtrOffset + 4, 0);
			tempStackPtrOffset += sizeof(long long);
			break;
		case rvmiPushMem:
		{
			unsigned reg = *microcode++;
			unsigned offset = *microcode++;
			unsigned size = *microcode++;

			EMIT_OP_REG_REG(ctx.ctx, o_mov, rEAX, rESI); // Save frame register
			EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rESI, sDWORD, rREG, reg * 8);
			EMIT_OP_REG_NUM(ctx.ctx, o_add, rESI, offset);
			EMIT_OP_REG_RPTR(ctx.ctx, o_lea, rEDI, sDWORD, rTempStack, tempStackPtrOffset);
			EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, size >> 2);
			EMIT_OP(ctx.ctx, o_rep_movsd);
			EMIT_OP_REG_REG(ctx.ctx, o_mov, rESI, rEAX); // Restore frame register
			EMIT_REG_READ(ctx.ctx, rESI);

			tempStackPtrOffset += size;
		}
		break;
		}
	}

	// Add call stack frame
	EMIT_OP_REG_ADDR(ctx.ctx, o_mov, rECX, sDWORD, uintptr_t(&ctx.vmState->callStackTop));
	EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, rECX, nullcOffsetOf(ctx.vmState->callStackTop, instruction), ctx.currInstructionPos + 1); // vmState->callStackTop->instruction = vmState->callInstructionPos + 1;
	EMIT_OP_RPTR_NUM(ctx.ctx, o_add, sDWORD, uintptr_t(&ctx.vmState->callStackTop), sizeof(CodeGenRegVmCallStackEntry)); // vmState->callStackTop++;

	//vmState->regFileLastTop
	EMIT_OP_REG_ADDR(ctx.ctx, o_mov, rECX, sDWORD, uintptr_t(&ctx.vmState->regFileLastTop));

	//vmState->regFileLastTop[rvrrGlobals].ptrValue = uintptr_t(vmState->dataStackBase);
	EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, rECX, rvrrGlobals * 8, uintptr_t(ctx.vmState->dataStackBase));

	//vmState->regFileLastTop[rvrrFrame].ptrValue = uintptr_t(vmState->dataStackTop);
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rECX, rvrrFrame * 8, rTempStack);

	//vmState->regFileLastTop[rvrrConstants].ptrValue = uintptr_t(ctx.exRegVmConstants);
	EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, rECX, rvrrConstants * 8, uintptr_t(ctx.exRegVmConstants));

	//vmState->regFileLastTop[rvrrRegisters].ptrValue = uintptr_t(vmState->regFileLastTop);
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rECX, rvrrRegisters * 8, rECX);

	//vmState->regFileLastPtr = vmState->regFileLastTop;
	EMIT_OP_ADDR_REG(ctx.ctx, o_mov, sDWORD, uintptr_t(&ctx.vmState->regFileLastPtr), rECX);
#endif

	microcode++;

	return microcode;
}